

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O2

FEvent * __thiscall FEventTree::GetNewNode(FEventTree *this)

{
  FEvent *pFVar1;
  
  pFVar1 = this->Spare;
  if (pFVar1 != (FEvent *)0x0) {
    this->Spare = pFVar1->Left;
    return pFVar1;
  }
  pFVar1 = (FEvent *)operator_new(0x28);
  return pFVar1;
}

Assistant:

FEvent *FEventTree::GetNewNode ()
{
	FEvent *node;

	if (Spare != NULL)
	{
		node = Spare;
		Spare = node->Left;
	}
	else
	{
		node = new FEvent;
	}
	return node;
}